

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QObject*,QPointer<QHttp2Stream>>::emplace<QPointer<QHttp2Stream>const&>
          (QHash<QObject_*,_QPointer<QHttp2Stream>_> *this,QObject **key,
          QPointer<QHttp2Stream> *args)

{
  long lVar1;
  bool bVar2;
  QHash<QObject_*,_QPointer<QHttp2Stream>_> *in_RDX;
  QPointer<QHttp2Stream> *in_RSI;
  QObject **in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QObject_*,_QPointer<QHttp2Stream>_> copy;
  QPointer<QHttp2Stream> *in_stack_ffffffffffffff98;
  QPointer<QHttp2Stream> *in_stack_ffffffffffffffa0;
  QPointer<QHttp2Stream> *in_stack_ffffffffffffffa8;
  undefined1 local_30 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QObject_*,_QPointer<QHttp2Stream>_>::isDetached
                    ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffffa0);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_>::shouldGrow
                      ((Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)*in_RDI);
    if (bVar2) {
      QPointer<QHttp2Stream>::QPointer(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_30 = (undefined1  [16])emplace_helper<QPointer<QHttp2Stream>>(in_RDX,in_RDI,in_RSI);
      QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2e0aae);
    }
    else {
      local_30 = (undefined1  [16])
                 emplace_helper<QPointer<QHttp2Stream>const&>
                           (in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QHash<QObject_*,_QPointer<QHttp2Stream>_>::QHash
              ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffffa0,
               (QHash<QObject_*,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffff98);
    QHash<QObject_*,_QPointer<QHttp2Stream>_>::detach
              ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffffa0);
    local_30 = (undefined1  [16])
               emplace_helper<QPointer<QHttp2Stream>const&>(in_RDX,in_RDI,in_stack_ffffffffffffffa8)
    ;
    QHash<QObject_*,_QPointer<QHttp2Stream>_>::~QHash
              ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)local_30._0_8_;
    iVar3.i.bucket = local_30._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }